

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O1

_Bool cs_reg_write(csh ud,cs_insn *insn,uint reg_id)

{
  cs_detail *pcVar1;
  long lVar2;
  undefined4 uVar3;
  ulong uVar4;
  long lVar5;
  _Bool _Var6;
  
  if (ud != 0) {
    uVar3 = 7;
    if (*(int *)(ud + 0xe0) != 0) {
      if (insn->id == 0) {
        uVar3 = 0xb;
      }
      else {
        pcVar1 = insn->detail;
        if (pcVar1 != (cs_detail *)0x0) {
          uVar4 = (ulong)pcVar1->regs_write_count;
          _Var6 = uVar4 != 0;
          if ((_Var6) && (_Var6 = true, pcVar1->regs_write[0] != reg_id)) {
            lVar2 = 0;
            do {
              lVar5 = lVar2;
              if (uVar4 - 1 == lVar5) break;
              lVar2 = lVar5 + 1;
            } while (pcVar1->regs_write[lVar5 + 1] != reg_id);
            _Var6 = lVar5 + 1U < uVar4;
          }
          return _Var6;
        }
      }
    }
    *(undefined4 *)(ud + 0x58) = uVar3;
  }
  return false;
}

Assistant:

CAPSTONE_EXPORT
bool cs_reg_write(csh ud, const cs_insn *insn, unsigned int reg_id)
{
	struct cs_struct *handle;
	if (!ud)
		return false;

	handle = (struct cs_struct *)(uintptr_t)ud;

	if (!handle->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return false;
	}

	if(!insn->id) {
		handle->errnum = CS_ERR_SKIPDATA;
		return false;
	}

	if(!insn->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return false;
	}

	return arr_exist(insn->detail->regs_write, insn->detail->regs_write_count, reg_id);
}